

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colList.c
# Opt level: O2

void Col_MListSetAt(Col_Word mlist,size_t index,Col_Word element)

{
  size_t sVar1;
  size_t sVar2;
  
  sVar1 = Col_ListLength(mlist);
  sVar2 = Col_ListLoopLength(mlist);
  if (index < sVar1 || sVar2 != 0) {
    if (sVar2 != 0 && sVar1 <= index) {
      index = (index - (sVar1 - sVar2)) % sVar2 + (sVar1 - sVar2);
    }
    MListSetAt((Col_Word *)(mlist + 0x10),index,element);
    return;
  }
  Col_Error(COL_VALUECHECK,ColibriDomain,0x15,index,sVar1);
  return;
}

Assistant:

void
Col_MListSetAt(
    Col_Word mlist,     /*!< Mutable list to modify. */
    size_t index,       /*!< Element index. */
    Col_Word element)   /*!< New element. */
{
    size_t length, loop;

    /*
     * Check preconditions.
     */

    /*! @typecheck{COL_ERROR_MLIST,mlist} */
    TYPECHECK_MLIST(mlist) return;

    /*! @valuecheck{COL_ERROR_LISTINDEX,index < [Col_ListLength(mlist)](@ref Col_ListLength)} */
    length = Col_ListLength(mlist);
    loop = Col_ListLoopLength(mlist);
    if (!loop) VALUECHECK_BOUNDS(index, length) return;

    if (loop && index >= length) {
        /*
         * Cyclic list. Normalize index.
         */

        index = (index - (length-loop)) % loop + (length-loop);
    }

    ASSERT(WORD_TYPE(mlist) == WORD_TYPE_WRAP);
    MListSetAt(&WORD_WRAP_SOURCE(mlist), index, element);
}